

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlrecord.cpp
# Opt level: O2

void __thiscall QSqlRecord::append(QSqlRecord *this,QSqlField *field)

{
  QExplicitlySharedDataPointer<QSqlRecordPrivate>::detach(&this->d);
  QList<QSqlField>::emplaceBack<QSqlField_const&>(&((this->d).d.ptr)->fields,field);
  return;
}

Assistant:

void QSqlRecord::append(const QSqlField &field)
{
    detach();
    d->fields.append(field);
}